

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O2

bool xercesc_4_0::XMLChar1_1::isValidNmtoken(XMLCh *toCheck,XMLSize_t count)

{
  XMLCh *pXVar1;
  XMLCh XVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  if (count == 0) {
    return false;
  }
  pXVar1 = toCheck + count;
  bVar3 = false;
  do {
    while( true ) {
      while( true ) {
        bVar5 = pXVar1 <= toCheck;
        if (bVar5) {
          return bVar5;
        }
        XVar2 = *toCheck;
        toCheck = toCheck + 1;
        if ((XVar2 & 0xfc00U) != 0xdc00) break;
        bVar4 = !bVar3;
        bVar3 = false;
        if (bVar4) {
          return bVar5;
        }
      }
      if ((XVar2 & 0xfc00U) != 0xd800) break;
      bVar4 = (bool)(0xdb7f < (ushort)XVar2 | bVar3);
      bVar3 = true;
      if (bVar4) {
        return bVar5;
      }
    }
    if (bVar3) {
      return bVar5;
    }
    bVar3 = false;
  } while (((&fgCharCharsTable1_1)[(ushort)XVar2] & 4) != 0);
  return bVar5;
}

Assistant:

bool XMLChar1_1::isValidNmtoken(const   XMLCh*        const    toCheck
                              , const   XMLSize_t              count)
{
    if (count == 0)
        return false;

    const XMLCh* curCh = toCheck;
    const XMLCh* endPtr = toCheck + count;
    XMLCh nextCh;

    bool    gotLeadingSurrogate = false;
    while (curCh < endPtr)
    {
        nextCh = *curCh++;

        // Deal with surrogate pairs
        if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
        {
            //  It's a leading surrogate. If we already got one, then
            //  issue an error, else set leading flag to make sure that
            //  we look for a trailing next time.
            if (nextCh > 0xDB7F || gotLeadingSurrogate)
            {
                return false;
            }
            else
                gotLeadingSurrogate = true;
        }
        else
        {
            //  If it's a trailing surrogate, make sure that we are
            //  prepared for that. Else, it's just a regular char so make
            //  sure that we were not expected a trailing surrogate.
            if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
            {
                // It's trailing, so make sure we were expecting it
                if (!gotLeadingSurrogate)
                    return false;
            }
            else
            {
                //  It's just a char, so make sure we were not expecting a
                //  trailing surrogate.
                if (gotLeadingSurrogate) {
                    return false;
                }
                // It's got to at least be a valid XML character
                else if (!(fgCharCharsTable1_1[nextCh] & gNameCharMask))
                {
                    return false;
                }
            }
            gotLeadingSurrogate = false;
        }
    }
    return true;
}